

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4afdb9::Db::parseEncoding(Db *this)

{
  char cVar1;
  char *pcVar2;
  ForwardTemplateReference **ppFVar3;
  ForwardTemplateReference **ppFVar4;
  Node **ppNVar5;
  bool bVar6;
  bool bVar7;
  Node *pNVar8;
  Node *pNVar9;
  char *pcVar10;
  ForwardTemplateReference **ppFVar11;
  Node **ppNVar12;
  FunctionEncoding *pFVar13;
  SpecialName *pSVar14;
  Node *pNVar15;
  size_t Index;
  Node NVar16;
  StringView SVar17;
  Node *ReturnType;
  Node *Attrs;
  NameState NameInfo;
  Node *Arg;
  size_t sStack_50;
  Node *Name;
  anon_class_8_1_8991fb9c IsEndOfEncoding;
  
  pcVar10 = this->First;
  pcVar2 = this->Last;
  if (pcVar2 == pcVar10) {
LAB_00197075:
    NameInfo._0_8_ = ((ulong)NameInfo._0_8_ >> 0x10 & 0xffff) << 0x10;
    NameInfo.ReferenceQualifier = FrefQualNone;
    NameInfo.ForwardTemplateRefsBegin =
         (long)(this->ForwardTemplateRefs).Last - (long)(this->ForwardTemplateRefs).First >> 3;
    IsEndOfEncoding.this = this;
    pNVar8 = parseName(this,&NameInfo);
    if (pNVar8 != (Node *)0x0) {
      ppFVar3 = (this->ForwardTemplateRefs).Last;
      ppFVar4 = (this->ForwardTemplateRefs).First;
      Name = pNVar8;
      for (Index = NameInfo.ForwardTemplateRefsBegin;
          Index < (ulong)((long)ppFVar3 - (long)ppFVar4 >> 3); Index = Index + 1) {
        ppFVar11 = PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL>::
                   operator[](&this->ForwardTemplateRefs,Index);
        if ((ulong)((long)(this->TemplateParams).Last - (long)(this->TemplateParams).First >> 3) <=
            (*ppFVar11)->Index) goto LAB_001976e0;
        ppNVar12 = PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::operator[]
                             (&this->TemplateParams,(*ppFVar11)->Index);
        pNVar9 = *ppNVar12;
        ppFVar11 = PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL>::
                   operator[](&this->ForwardTemplateRefs,Index);
        (*ppFVar11)->Ref = pNVar9;
      }
      ppFVar3 = (this->ForwardTemplateRefs).First;
      if ((ulong)((long)(this->ForwardTemplateRefs).Last - (long)ppFVar3 >> 3) <
          NameInfo.ForwardTemplateRefsBegin) {
        __assert_fail("Index <= size() && \"dropBack() can\'t expand!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                      ,0x780,
                      "void (anonymous namespace)::PODSmallVector<(anonymous namespace)::ForwardTemplateReference *, 4>::dropBack(size_t) [T = (anonymous namespace)::ForwardTemplateReference *, N = 4]"
                     );
      }
      (this->ForwardTemplateRefs).Last = ppFVar3 + NameInfo.ForwardTemplateRefsBegin;
      bVar6 = parseEncoding::anon_class_8_1_8991fb9c::operator()(&IsEndOfEncoding);
      if (bVar6) {
        return pNVar8;
      }
      Attrs = (Node *)0x0;
      SVar17.Last = "";
      SVar17.First = "Ua9enable_ifI";
      bVar6 = consumeIf(this,SVar17);
      if (bVar6) {
        ppNVar12 = (this->Names).Last;
        ppNVar5 = (this->Names).First;
        while( true ) {
          pcVar10 = this->First;
          if ((pcVar10 != this->Last) && (*pcVar10 == 'E')) {
            this->First = pcVar10 + 1;
            NVar16 = (Node)popTrailingNodeArray(this,(long)ppNVar12 - (long)ppNVar5 >> 3);
            Attrs = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
            Attrs->K = KEnableIfAttr;
            Attrs->RHSComponentCache = No;
            Attrs->ArrayCache = No;
            Attrs->FunctionCache = No;
            Attrs->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00207760;
            Attrs[1] = NVar16;
            goto LAB_001973fa;
          }
          pNVar8 = parseTemplateArg(this);
          Arg = pNVar8;
          if (pNVar8 == (Node *)0x0) break;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&Arg);
        }
      }
      else {
LAB_001973fa:
        ReturnType = (Node *)0x0;
        if (((NameInfo.CtorDtorConversion != false) || (NameInfo.EndsWithTemplateArgs != true)) ||
           (ReturnType = parseType(this), ReturnType != (Node *)0x0)) {
          pcVar10 = this->First;
          if ((pcVar10 == this->Last) || (*pcVar10 != 'v')) {
            ppNVar12 = (this->Names).Last;
            ppNVar5 = (this->Names).First;
            do {
              pNVar8 = parseType(this);
              Arg = pNVar8;
              if (pNVar8 == (Node *)0x0) goto LAB_001976e0;
              PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&Arg);
              bVar6 = parseEncoding::anon_class_8_1_8991fb9c::operator()(&IsEndOfEncoding);
            } while (!bVar6);
            _Arg = popTrailingNodeArray(this,(long)ppNVar12 - (long)ppNVar5 >> 3);
          }
          else {
            this->First = pcVar10 + 1;
            _Arg = (NodeArray)ZEXT816(0);
          }
          pFVar13 = (anonymous_namespace)::Db::
                    make<(anonymous_namespace)::FunctionEncoding,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,(anonymous_namespace)::NodeArray,(anonymous_namespace)::Node*&,(anonymous_namespace)::Qualifiers&,(anonymous_namespace)::FunctionRefQual&>
                              ((Db *)this,&ReturnType,&Name,(NodeArray *)&Arg,&Attrs,
                               &NameInfo.CVQualifiers,&NameInfo.ReferenceQualifier);
          return &pFVar13->super_Node;
        }
      }
    }
LAB_001976e0:
    pNVar9 = (Node *)0x0;
  }
  else {
    if (*pcVar10 == 'G') {
      if (1 < (ulong)((long)pcVar2 - (long)pcVar10)) {
        if (pcVar10[1] == 'R') {
          this->First = pcVar10 + 2;
          pNVar8 = parseName(this,(NameState *)0x0);
          if (pNVar8 == (Node *)0x0) {
            return (Node *)0x0;
          }
          bVar6 = parseSeqId(this,(size_t *)&NameInfo);
          pcVar10 = this->First;
          if ((pcVar10 == this->Last) || (*pcVar10 != '_')) {
            if (!bVar6) goto LAB_001976e0;
          }
          else {
            this->First = pcVar10 + 1;
          }
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KSpecialName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
          pNVar9[1]._vptr_Node = (_func_int **)"reference temporary for ";
          pcVar10 = "";
          goto LAB_00197749;
        }
        if (pcVar10[1] == 'V') {
          this->First = pcVar10 + 2;
          pNVar8 = parseName(this,(NameState *)0x0);
          if (pNVar8 == (Node *)0x0) {
            return (Node *)0x0;
          }
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KSpecialName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
          pNVar9[1]._vptr_Node = (_func_int **)"guard variable for ";
          pcVar10 = "";
          goto LAB_00197749;
        }
      }
      goto LAB_001976e0;
    }
    if (*pcVar10 != 'T') goto LAB_00197075;
    if ((ulong)((long)pcVar2 - (long)pcVar10) < 2) {
switchD_0019727b_caseD_55:
      pcVar10 = pcVar10 + 1;
      this->First = pcVar10;
      if (pcVar2 == pcVar10) {
        bVar6 = false;
      }
      else {
        bVar6 = *pcVar10 == 'v';
      }
      bVar7 = parseCallOffset(this);
      if ((bVar7) || (pNVar8 = parseEncoding(this), pNVar8 == (Node *)0x0)) goto LAB_001976e0;
      pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar9->K = KSpecialName;
      pNVar9->RHSComponentCache = No;
      pNVar9->ArrayCache = No;
      pNVar9->FunctionCache = No;
      pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
      if (bVar6) {
        pNVar9[1]._vptr_Node = (_func_int **)0x1c2def;
        pcVar10 = "";
      }
      else {
        pNVar9[1]._vptr_Node = (_func_int **)"non-virtual thunk to ";
        pcVar10 = "";
      }
    }
    else {
      cVar1 = pcVar10[1];
      switch(cVar1) {
      case 'S':
        this->First = pcVar10 + 2;
        pNVar8 = parseType(this);
        if (pNVar8 == (Node *)0x0) goto LAB_001976e0;
        pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar9->K = KSpecialName;
        pNVar9->RHSComponentCache = No;
        pNVar9->ArrayCache = No;
        pNVar9->FunctionCache = No;
        pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
        pNVar9[1]._vptr_Node = (_func_int **)"typeinfo name for ";
        pcVar10 = "";
        break;
      case 'T':
        this->First = pcVar10 + 2;
        pNVar8 = parseType(this);
        if (pNVar8 == (Node *)0x0) goto LAB_001976e0;
        pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar9->K = KSpecialName;
        pNVar9->RHSComponentCache = No;
        pNVar9->ArrayCache = No;
        pNVar9->FunctionCache = No;
        pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
        pNVar9[1]._vptr_Node = (_func_int **)"VTT for ";
        pcVar10 = "";
        break;
      case 'U':
        goto switchD_0019727b_caseD_55;
      case 'V':
        this->First = pcVar10 + 2;
        pNVar8 = parseType(this);
        if (pNVar8 == (Node *)0x0) goto LAB_001976e0;
        pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar9->K = KSpecialName;
        pNVar9->RHSComponentCache = No;
        pNVar9->ArrayCache = No;
        pNVar9->FunctionCache = No;
        pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
        pNVar9[1]._vptr_Node = (_func_int **)0x1c2e3b;
        pcVar10 = "";
        break;
      case 'W':
        this->First = pcVar10 + 2;
        NameInfo._0_8_ = parseName(this,(NameState *)0x0);
        if ((Node *)NameInfo._0_8_ == (Node *)0x0) {
          return (Node *)0x0;
        }
        pSVar14 = (anonymous_namespace)::Db::
                  make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
                            ((Db *)this,(char (*) [34])"thread-local wrapper routine for ",
                             (Node **)&NameInfo);
        return &pSVar14->super_Node;
      default:
        if (cVar1 == 'C') {
          this->First = pcVar10 + 2;
          pNVar8 = parseType(this);
          if (((pNVar8 != (Node *)0x0) &&
              (SVar17 = parseNumber(this,true), SVar17.First != SVar17.Last)) &&
             ((pcVar10 = this->First, pcVar10 != this->Last && (*pcVar10 == '_')))) {
            this->First = pcVar10 + 1;
            pNVar9 = parseType(this);
            if (pNVar9 != (Node *)0x0) {
              pNVar15 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
              pNVar15->K = KCtorVtableSpecialName;
              pNVar15->RHSComponentCache = No;
              pNVar15->ArrayCache = No;
              pNVar15->FunctionCache = No;
              pNVar15->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206688;
              pNVar15[1]._vptr_Node = (_func_int **)pNVar9;
              *(Node **)&pNVar15[1].K = pNVar8;
              return pNVar15;
            }
          }
          goto LAB_001976e0;
        }
        if (cVar1 == 'H') {
          this->First = pcVar10 + 2;
          pNVar8 = parseName(this,(NameState *)0x0);
          if (pNVar8 == (Node *)0x0) {
            return (Node *)0x0;
          }
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KSpecialName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
          pNVar9[1]._vptr_Node = (_func_int **)"thread-local initialization routine for ";
          pcVar10 = "";
        }
        else if (cVar1 == 'I') {
          this->First = pcVar10 + 2;
          pNVar8 = parseType(this);
          if (pNVar8 == (Node *)0x0) goto LAB_001976e0;
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KSpecialName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
          pNVar9[1]._vptr_Node = (_func_int **)"typeinfo for ";
          pcVar10 = "";
        }
        else {
          if (cVar1 != 'c') goto switchD_0019727b_caseD_55;
          this->First = pcVar10 + 2;
          bVar6 = parseCallOffset(this);
          if (((bVar6) || (bVar6 = parseCallOffset(this), bVar6)) ||
             (pNVar8 = parseEncoding(this), pNVar8 == (Node *)0x0)) goto LAB_001976e0;
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KSpecialName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00206630;
          pNVar9[1]._vptr_Node = (_func_int **)"covariant return thunk to ";
          pcVar10 = "";
        }
      }
    }
LAB_00197749:
    *(char **)&pNVar9[1].K = pcVar10;
    pNVar9[2]._vptr_Node = (_func_int **)pNVar8;
  }
  return pNVar9;
}

Assistant:

Node *Db::parseEncoding() {
  if (look() == 'G' || look() == 'T')
    return parseSpecialName();

  auto IsEndOfEncoding = [&] {
    // The set of chars that can potentially follow an <encoding> (none of which
    // can start a <type>). Enumerating these allows us to avoid speculative
    // parsing.
    return numLeft() == 0 || look() == 'E' || look() == '.' || look() == '_';
  };

  NameState NameInfo(this);
  Node *Name = parseName(&NameInfo);
  if (Name == nullptr)
    return nullptr;

  if (resolveForwardTemplateRefs(NameInfo))
    return nullptr;

  if (IsEndOfEncoding())
    return Name;

  Node *Attrs = nullptr;
  if (consumeIf("Ua9enable_ifI")) {
    size_t BeforeArgs = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    Attrs = make<EnableIfAttr>(popTrailingNodeArray(BeforeArgs));
  }

  Node *ReturnType = nullptr;
  if (!NameInfo.CtorDtorConversion && NameInfo.EndsWithTemplateArgs) {
    ReturnType = parseType();
    if (ReturnType == nullptr)
      return nullptr;
  }

  if (consumeIf('v'))
    return make<FunctionEncoding>(ReturnType, Name, NodeArray(),
                                  Attrs, NameInfo.CVQualifiers,
                                  NameInfo.ReferenceQualifier);

  size_t ParamsBegin = Names.size();
  do {
    Node *Ty = parseType();
    if (Ty == nullptr)
      return nullptr;
    Names.push_back(Ty);
  } while (!IsEndOfEncoding());

  return make<FunctionEncoding>(ReturnType, Name,
                                popTrailingNodeArray(ParamsBegin),
                                Attrs, NameInfo.CVQualifiers,
                                NameInfo.ReferenceQualifier);
}